

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

int __thiscall
MeCab::Tokenizer<mecab_learner_node_t,_mecab_learner_path_t>::close
          (Tokenizer<mecab_learner_node_t,_mecab_learner_path_t> *this,int __fd)

{
  bool bVar1;
  int iVar2;
  reference ppDVar3;
  iterator it;
  Dictionary *in_stack_ffffffffffffffd8;
  Dictionary **local_18;
  __normal_iterator<MeCab::Dictionary_**,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
  local_10;
  Tokenizer<mecab_learner_node_t,_mecab_learner_path_t> *local_8;
  
  local_8 = this;
  local_10._M_current =
       (Dictionary **)
       std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::begin
                 ((vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_> *)
                  in_stack_ffffffffffffffd8);
  while( true ) {
    local_18 = (Dictionary **)
               std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::end
                         ((vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_> *)
                          in_stack_ffffffffffffffd8);
    iVar2 = (int)&local_18;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<MeCab::Dictionary_**,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
                        *)this,(__normal_iterator<MeCab::Dictionary_**,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
                                *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    ppDVar3 = __gnu_cxx::
              __normal_iterator<MeCab::Dictionary_**,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
              ::operator*(&local_10);
    in_stack_ffffffffffffffd8 = *ppDVar3;
    if (in_stack_ffffffffffffffd8 != (Dictionary *)0x0) {
      (*in_stack_ffffffffffffffd8->_vptr_Dictionary[1])();
    }
    __gnu_cxx::
    __normal_iterator<MeCab::Dictionary_**,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
    ::operator++(&local_10);
  }
  std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::clear
            ((vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_> *)0x1afeb6);
  std::
  vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
  ::clear((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
           *)0x1afec7);
  iVar2 = CharProperty::close(&this->property_,iVar2);
  return iVar2;
}

Assistant:

void Tokenizer<N, P>::close() {
  for (std::vector<Dictionary *>::iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    delete *it;
  }
  dic_.clear();
  unk_tokens_.clear();
  property_.close();
}